

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O2

void pyramid_addCombineMove
               (MovePack *movePack,SPOTTYPE spot1,uchar spot1Index,SPOTTYPE spot2,uchar spot2Index)

{
  MovePack *movePack_00;
  Move *pMVar1;
  
  movePack_00 = movePack_create();
  pMVar1 = move_create(MOVE,spot1,spot1Index,-1,FOUNDATION,'\0',-1);
  movePack_add(movePack_00,pMVar1);
  pMVar1 = move_create(MOVE,spot2,spot2Index,-1,FOUNDATION,'\0',-1);
  movePack_add(movePack_00,pMVar1);
  pMVar1 = move_createMultiple(movePack_00);
  movePack_add(movePack,pMVar1);
  return;
}

Assistant:

void pyramid_addCombineMove(MovePack * movePack, SPOTTYPE spot1, unsigned char spot1Index, SPOTTYPE spot2, unsigned char spot2Index)
{
	MovePack * subPack = movePack_create();
	movePack_add(subPack, move_create(MOVE, spot1, spot1Index, -1, FOUNDATION, 0, -1));
	movePack_add(subPack, move_create(MOVE, spot2, spot2Index, -1, FOUNDATION, 0, -1));
	movePack_add(movePack, move_createMultiple(subPack));
}